

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

void __thiscall
pybind11::cpp_function::initialize_generic
          (cpp_function *this,function_record *rec,char *text,type_info **types,size_t args)

{
  char cVar1;
  pointer paVar2;
  type_info *tp;
  handle obj;
  cpp_function *pcVar3;
  int iVar4;
  char *pcVar5;
  type_info *ptVar6;
  function_record *pfVar7;
  PyMethodDef *pPVar8;
  PyObject *pPVar9;
  PyObject *pPVar10;
  function_record *pfVar11;
  object *object;
  long lVar12;
  pointer paVar13;
  long lVar14;
  function_record *pfVar15;
  long lVar16;
  long lVar17;
  bool bVar18;
  string signatures;
  ulong local_c0;
  object local_b0;
  cpp_function *local_a8;
  capsule rec_capsule_1;
  object scope_module;
  string signature;
  
  pcVar5 = "";
  if (rec->name != (char *)0x0) {
    pcVar5 = rec->name;
  }
  local_a8 = this;
  pcVar5 = strdup(pcVar5);
  rec->name = pcVar5;
  if (rec->doc != (char *)0x0) {
    pcVar5 = strdup(rec->doc);
    rec->doc = pcVar5;
  }
  paVar2 = (rec->args).
           super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (paVar13 = (rec->args).
                 super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                 ._M_impl.super__Vector_impl_data._M_start; paVar13 != paVar2;
      paVar13 = paVar13 + 0x18) {
    if (*(char **)paVar13 != (char *)0x0) {
      pcVar5 = strdup(*(char **)paVar13);
      *(char **)paVar13 = pcVar5;
    }
    if (*(char **)(paVar13 + 8) == (char *)0x0) {
      if (*(size_type *)(paVar13 + 0x10) != 0) {
        signatures.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_62f2;
        signatures.field_2._8_8_ = 0;
        signatures._M_string_length = *(size_type *)(paVar13 + 0x10);
        detail::
        object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>::
        operator()((object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>
                    *)&rec_capsule_1);
        cast<std::__cxx11::string>(&signature,(pybind11 *)&rec_capsule_1,object);
        pcVar5 = strdup(signature._M_dataplus._M_p);
        *(char **)(paVar13 + 8) = pcVar5;
        std::__cxx11::string::~string((string *)&signature);
        pybind11::object::~object((object *)&rec_capsule_1);
        pybind11::object::~object((object *)((long)&signatures.field_2 + 8));
      }
    }
    else {
      pcVar5 = strdup(*(char **)(paVar13 + 8));
      *(char **)(paVar13 + 8) = pcVar5;
    }
  }
  signature._M_dataplus._M_p = (pointer)&signature.field_2;
  signature._M_string_length = 0;
  signature.field_2._M_local_buf[0] = '\0';
  local_c0 = 0;
  lVar12 = 0;
  lVar16 = 0;
  do {
    lVar14 = 0;
    lVar17 = lVar16;
LAB_001155aa:
    lVar16 = lVar17 + 1;
    cVar1 = text[lVar17];
    if (cVar1 == '\0') {
      if ((lVar14 != 0) || (types[lVar12] != (type_info *)0x0)) {
        pybind11_fail("Internal error while parsing type signature (2)");
      }
      pcVar5 = strdup(signature._M_dataplus._M_p);
      rec->signature = pcVar5;
      std::
      vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
      ::_M_shrink_to_fit(&rec->args);
      pcVar5 = rec->name;
      iVar4 = strcmp(pcVar5,"__init__");
      if (iVar4 == 0) {
        bVar18 = true;
      }
      else {
        iVar4 = strcmp(pcVar5,"__setstate__");
        bVar18 = iVar4 == 0;
      }
      rec->field_0x59 = rec->field_0x59 & 0xfe | bVar18;
      rec->nargs = (uint16_t)args;
      pPVar9 = (rec->sibling).m_ptr;
      if (pPVar9 != (PyObject *)0x0) {
        iVar4 = _PyObject_TypeCheck(pPVar9,(PyTypeObject *)&PyCFunction_Type);
        if (iVar4 == 0) {
          if (((rec->sibling).m_ptr != (PyObject *)&_Py_NoneStruct) && (*rec->name != '_')) {
            std::__cxx11::string::string((string *)&scope_module,rec->name,(allocator *)&local_b0);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &rec_capsule_1,"Cannot overload existing non-function object \"",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &scope_module);
            std::operator+(&signatures,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &rec_capsule_1,"\" with a function of the same name");
            pybind11_fail(&signatures);
          }
        }
        else {
          pPVar9 = (rec->sibling).m_ptr;
          if ((*(byte *)(pPVar9[1].ob_refcnt + 0x10) & 0x20) == 0) {
            signatures._M_dataplus._M_p = (pointer)pPVar9[1].ob_type;
            if ((PyTypeObject *)signatures._M_dataplus._M_p != (PyTypeObject *)0x0) {
              (((PyTypeObject *)signatures._M_dataplus._M_p)->ob_base).ob_base.ob_refcnt =
                   (((PyTypeObject *)signatures._M_dataplus._M_p)->ob_base).ob_base.ob_refcnt + 1;
            }
          }
          else {
            signatures._M_dataplus._M_p = (pointer)0x0;
          }
          pfVar7 = capsule::operator_cast_to_function_record_((capsule *)&signatures);
          pPVar9 = (pfVar7->scope).m_ptr;
          pPVar10 = (rec->scope).m_ptr;
          pybind11::object::~object((object *)&signatures);
          if (pPVar9 == pPVar10) {
            pPVar9 = (rec->sibling).m_ptr;
            (local_a8->super_function).super_object.super_handle.m_ptr = pPVar9;
            pfVar15 = pfVar7;
            if (pPVar9 != (PyObject *)0x0) {
              pPVar9->ob_refcnt = pPVar9->ob_refcnt + 1;
            }
            do {
              pfVar11 = pfVar15;
              pfVar15 = pfVar11->next;
            } while (pfVar15 != (function_record *)0x0);
            pfVar11->next = rec;
            signatures._M_dataplus._M_p = (pointer)&signatures.field_2;
            signatures._M_string_length = 0;
            signatures.field_2._M_allocated_capacity =
                 signatures.field_2._M_allocated_capacity & 0xffffffffffffff00;
            if (DAT_00125ca9 == '\x01') {
              std::__cxx11::string::append((char *)&signatures);
              std::__cxx11::string::append((char *)&signatures);
              std::__cxx11::string::append((char *)&signatures);
            }
            bVar18 = false;
LAB_00115a18:
            iVar4 = 0;
            while (pfVar15 = pfVar7, pcVar3 = local_a8, pfVar15 != (function_record *)0x0) {
              if (DAT_00125ca9 == '\x01') {
                if (!bVar18) {
                  iVar4 = iVar4 + 1;
                  std::__cxx11::to_string((string *)&scope_module,iVar4);
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&rec_capsule_1,(string *)&scope_module,". ");
                  std::__cxx11::string::append((string *)&signatures);
                  std::__cxx11::string::~string((string *)&rec_capsule_1);
                  std::__cxx11::string::~string((string *)&scope_module);
                }
                std::__cxx11::string::append((char *)&signatures);
                std::__cxx11::string::append((char *)&signatures);
                std::__cxx11::string::append((char *)&signatures);
              }
              if (((pfVar15->doc != (char *)0x0) && (*pfVar15->doc != '\0')) &&
                 (options::global_state()::instance == '\x01')) {
                if (DAT_00125ca9 == '\x01') {
                  std::__cxx11::string::append((char *)&signatures);
                }
                std::__cxx11::string::append((char *)&signatures);
                if (DAT_00125ca9 == '\x01') {
                  std::__cxx11::string::append((char *)&signatures);
                }
              }
              pfVar7 = (function_record *)0x0;
              if (pfVar15->next != (function_record *)0x0) {
                std::__cxx11::string::append((char *)&signatures);
                pfVar7 = pfVar15->next;
              }
            }
            pPVar9 = (local_a8->super_function).super_object.super_handle.m_ptr;
            free(*(void **)(pPVar9[1].ob_refcnt + 0x18));
            pcVar5 = strdup(signatures._M_dataplus._M_p);
            *(char **)(pPVar9[1].ob_refcnt + 0x18) = pcVar5;
            if ((rec->field_0x59 & 0x20) != 0) {
              pPVar10 = (PyObject *)
                        PyInstanceMethod_New
                                  ((pcVar3->super_function).super_object.super_handle.m_ptr);
              (pcVar3->super_function).super_object.super_handle.m_ptr = pPVar10;
              if (pPVar10 == (PyObject *)0x0) {
                pybind11_fail(
                             "cpp_function::cpp_function(): Could not allocate instance method object"
                             );
              }
              _Py_DECREF(pPVar9);
            }
            std::__cxx11::string::~string((string *)&signatures);
            std::__cxx11::string::~string((string *)&signature);
            return;
          }
        }
      }
      pPVar8 = (PyMethodDef *)operator_new(0x20);
      rec->def = pPVar8;
      *(undefined8 *)&pPVar8->ml_flags = 0;
      pPVar8->ml_doc = (char *)0x0;
      pPVar8->ml_name = rec->name;
      pPVar8->ml_meth = dispatcher;
      pPVar8->ml_flags = 3;
      capsule::capsule(&rec_capsule_1,rec,initialize_generic::anon_class_1_0_00000001::__invoke);
      pcVar3 = local_a8;
      scope_module.super_handle.m_ptr = (handle)(PyObject *)0x0;
      obj.m_ptr = (rec->scope).m_ptr;
      if (obj.m_ptr != (PyObject *)0x0) {
        bVar18 = hasattr(obj,"__module__");
        if (bVar18) {
          signatures._M_string_length = (size_type)(rec->scope).m_ptr;
          signatures.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_63a0;
          signatures.field_2._8_8_ = 0;
          detail::accessor::operator_cast_to_object((accessor *)&local_b0);
        }
        else {
          bVar18 = hasattr((rec->scope).m_ptr,"__name__");
          if (!bVar18) goto LAB_001159c8;
          signatures._M_string_length = (size_type)(rec->scope).m_ptr;
          signatures.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_63b7;
          signatures.field_2._8_8_ = 0;
          detail::accessor::operator_cast_to_object((accessor *)&local_b0);
        }
        pybind11::object::operator=(&scope_module,&local_b0);
        pybind11::object::~object(&local_b0);
        pybind11::object::~object((object *)((long)&signatures.field_2 + 8));
      }
LAB_001159c8:
      pPVar9 = (PyObject *)
               PyCMethod_New(rec->def,rec_capsule_1.super_object.super_handle.m_ptr,
                             scope_module.super_handle.m_ptr,0);
      (pcVar3->super_function).super_object.super_handle.m_ptr = pPVar9;
      if (pPVar9 == (PyObject *)0x0) {
        pybind11_fail("cpp_function::cpp_function(): Could not allocate function object");
      }
      pybind11::object::~object(&scope_module);
      pybind11::object::~object(&rec_capsule_1.super_object);
      signatures._M_dataplus._M_p = (pointer)&signatures.field_2;
      signatures._M_string_length = 0;
      signatures.field_2._M_allocated_capacity =
           signatures.field_2._M_allocated_capacity & 0xffffffffffffff00;
      bVar18 = true;
      pfVar7 = rec;
      goto LAB_00115a18;
    }
    lVar17 = lVar16;
    if (cVar1 == '%') {
      tp = types[lVar12];
      if (tp == (type_info *)0x0) {
        pybind11_fail("Internal error while parsing type signature (1)");
      }
      ptVar6 = detail::get_type_info(tp,false);
      lVar12 = lVar12 + 1;
      if (ptVar6 == (type_info *)0x0) {
        std::__cxx11::string::string
                  ((string *)&signatures,*(char **)(tp + 8) + (**(char **)(tp + 8) == '*'),
                   (allocator *)&rec_capsule_1);
        detail::clean_type_id(&signatures);
        std::__cxx11::string::append((string *)&signature);
        std::__cxx11::string::~string((string *)&signatures);
      }
      else {
        std::__cxx11::string::append((char *)&signature);
      }
      goto LAB_001155aa;
    }
    if (cVar1 != '}') {
      if (cVar1 == '{') {
        if ((lVar14 == 0) && (text[lVar16] != '*' && local_c0 < args)) {
          if ((rec->args).
              super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              (rec->args).
              super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            if ((rec->field_0x59 & 0x20) == 0 || local_c0 != 0) {
              std::__cxx11::to_string
                        ((string *)&rec_capsule_1,local_c0 - (((byte)rec->field_0x59 >> 5 & 1) != 0)
                        );
              std::operator+(&signatures,"arg",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &rec_capsule_1);
              std::__cxx11::string::append((string *)&signature);
              std::__cxx11::string::~string((string *)&signatures);
              std::__cxx11::string::~string((string *)&rec_capsule_1);
            }
            else {
              std::__cxx11::string::append((char *)&signature);
            }
          }
          else {
            std::__cxx11::string::append((char *)&signature);
          }
          std::__cxx11::string::append((char *)&signature);
        }
        lVar14 = lVar14 + 1;
      }
      else {
        std::__cxx11::string::push_back((char)&signature);
      }
      goto LAB_001155aa;
    }
    lVar14 = lVar14 + -1;
    if (lVar14 != 0) goto LAB_001155aa;
    paVar13 = (rec->args).
              super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((local_c0 <
         (ulong)(((long)(rec->args).
                        super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)paVar13) / 0x18)) &&
       (*(long *)(paVar13 + local_c0 * 0x18 + 8) != 0)) {
      std::__cxx11::string::append((char *)&signature);
      std::__cxx11::string::append((char *)&signature);
    }
    local_c0 = local_c0 + 1;
  } while( true );
}

Assistant:

void initialize_generic(detail::function_record *rec, const char *text,
                            const std::type_info *const *types, size_t args) {

        /* Create copies of all referenced C-style strings */
        rec->name = strdup(rec->name ? rec->name : "");
        if (rec->doc) rec->doc = strdup(rec->doc);
        for (auto &a: rec->args) {
            if (a.name)
                a.name = strdup(a.name);
            if (a.descr)
                a.descr = strdup(a.descr);
            else if (a.value)
                a.descr = strdup(a.value.attr("__repr__")().cast<std::string>().c_str());
        }

        /* Generate a proper function signature */
        std::string signature;
        size_t type_depth = 0, char_index = 0, type_index = 0, arg_index = 0;
        while (true) {
            char c = text[char_index++];
            if (c == '\0')
                break;

            if (c == '{') {
                // Write arg name for everything except *args, **kwargs and return type.
                if (type_depth == 0 && text[char_index] != '*' && arg_index < args) {
                    if (!rec->args.empty()) {
                        signature += rec->args[arg_index].name;
                    } else if (arg_index == 0 && rec->is_method) {
                        signature += "self";
                    } else {
                        signature += "arg" + std::to_string(arg_index - (rec->is_method ? 1 : 0));
                    }
                    signature += ": ";
                }
                ++type_depth;
            } else if (c == '}') {
                --type_depth;
                if (type_depth == 0) {
                    if (arg_index < rec->args.size() && rec->args[arg_index].descr) {
                        signature += "=";
                        signature += rec->args[arg_index].descr;
                    }
                    arg_index++;
                }
            } else if (c == '%') {
                const std::type_info *t = types[type_index++];
                if (!t)
                    pybind11_fail("Internal error while parsing type signature (1)");
                if (auto tinfo = detail::get_type_info(*t)) {
#if defined(PYPY_VERSION)
                    signature += handle((PyObject *) tinfo->type)
                                     .attr("__module__")
                                     .cast<std::string>() + ".";
#endif
                    signature += tinfo->type->tp_name;
                } else {
                    std::string tname(t->name());
                    detail::clean_type_id(tname);
                    signature += tname;
                }
            } else {
                signature += c;
            }
        }
        if (type_depth != 0 || types[type_index] != nullptr)
            pybind11_fail("Internal error while parsing type signature (2)");

        #if !defined(PYBIND11_CPP14)
            delete[] types;
            delete[] text;
        #endif

#if PY_MAJOR_VERSION < 3
        if (strcmp(rec->name, "__next__") == 0) {
            std::free(rec->name);
            rec->name = strdup("next");
        } else if (strcmp(rec->name, "__bool__") == 0) {
            std::free(rec->name);
            rec->name = strdup("__nonzero__");
        }
#endif
        rec->signature = strdup(signature.c_str());
        rec->args.shrink_to_fit();
        rec->is_constructor = !strcmp(rec->name, "__init__") || !strcmp(rec->name, "__setstate__");
        rec->nargs = (uint16_t) args;

#if PY_MAJOR_VERSION < 3
        if (rec->sibling && PyMethod_Check(rec->sibling.ptr()))
            rec->sibling = PyMethod_GET_FUNCTION(rec->sibling.ptr());
#endif

        detail::function_record *chain = nullptr, *chain_start = rec;
        if (rec->sibling) {
            if (PyCFunction_Check(rec->sibling.ptr())) {
                auto rec_capsule = reinterpret_borrow<capsule>(PyCFunction_GET_SELF(rec->sibling.ptr()));
                chain = (detail::function_record *) rec_capsule;
                /* Never append a method to an overload chain of a parent class;
                   instead, hide the parent's overloads in this case */
                if (chain->scope != rec->scope)
                    chain = nullptr;
            }
            // Don't trigger for things like the default __init__, which are wrapper_descriptors that we are intentionally replacing
            else if (!rec->sibling.is_none() && rec->name[0] != '_')
                pybind11_fail("Cannot overload existing non-function object \"" + std::string(rec->name) +
                        "\" with a function of the same name");
        }

        if (!chain) {
            /* No existing overload was found, create a new function object */
            rec->def = new PyMethodDef();
            memset(rec->def, 0, sizeof(PyMethodDef));
            rec->def->ml_name = rec->name;
            rec->def->ml_meth = reinterpret_cast<PyCFunction>(*dispatcher);
            rec->def->ml_flags = METH_VARARGS | METH_KEYWORDS;

            capsule rec_capsule(rec, [](PyObject *o) {
                destruct((detail::function_record *) PyCapsule_GetPointer(o, nullptr));
            });

            object scope_module;
            if (rec->scope) {
                if (hasattr(rec->scope, "__module__")) {
                    scope_module = rec->scope.attr("__module__");
                } else if (hasattr(rec->scope, "__name__")) {
                    scope_module = rec->scope.attr("__name__");
                }
            }

            m_ptr = PyCFunction_NewEx(rec->def, rec_capsule.ptr(), scope_module.ptr());
            if (!m_ptr)
                pybind11_fail("cpp_function::cpp_function(): Could not allocate function object");
        } else {
            /* Append at the end of the overload chain */
            m_ptr = rec->sibling.ptr();
            inc_ref();
            chain_start = chain;
            while (chain->next)
                chain = chain->next;
            chain->next = rec;
        }

        std::string signatures;
        int index = 0;
        /* Create a nice pydoc rec including all signatures and
           docstrings of the functions in the overload chain */
        if (chain && options::show_function_signatures()) {
            // First a generic signature
            signatures += rec->name;
            signatures += "(*args, **kwargs)\n";
            signatures += "Overloaded function.\n\n";
        }
        // Then specific overload signatures
        for (auto it = chain_start; it != nullptr; it = it->next) {
            if (options::show_function_signatures()) {
                if (chain)
                    signatures += std::to_string(++index) + ". ";
                signatures += rec->name;
                signatures += it->signature;
                signatures += "\n";
            }
            if (it->doc && strlen(it->doc) > 0 && options::show_user_defined_docstrings()) {
                if (options::show_function_signatures()) signatures += "\n";
                signatures += it->doc;
                if (options::show_function_signatures()) signatures += "\n";
            }
            if (it->next)
                signatures += "\n";
        }

        /* Install docstring */
        PyCFunctionObject *func = (PyCFunctionObject *) m_ptr;
        if (func->m_ml->ml_doc)
            std::free((char *) func->m_ml->ml_doc);
        func->m_ml->ml_doc = strdup(signatures.c_str());

        if (rec->is_method) {
            m_ptr = PYBIND11_INSTANCE_METHOD_NEW(m_ptr, rec->scope.ptr());
            if (!m_ptr)
                pybind11_fail("cpp_function::cpp_function(): Could not allocate instance method object");
            Py_DECREF(func);
        }
    }